

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::anon_unknown_0::IsnanCaseInstance::getInputValues
          (IsnanCaseInstance *this,int numValues,void **values)

{
  char cVar1;
  pointer pSVar2;
  deUint32 dVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  Random rnd;
  deRandom local_40;
  
  dVar3 = deStringHash((this->super_CommonFunctionTestInstance).m_name);
  deRandom_init(&local_40,dVar3 ^ 0xc2a39f);
  pSVar2 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = *(uint *)((long)&(pSVar2->varType).m_data + 4);
  iVar4 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  cVar1 = (&DAT_009ceaec)[(ulong)uVar6 * 4];
  uVar5 = 0;
  uVar8 = (ulong)(uint)(iVar4 * numValues);
  if (iVar4 * numValues < 1) {
    uVar8 = uVar5;
  }
  do {
    if (uVar8 == uVar5) {
      return;
    }
    fVar9 = deRandom_getFloat(&local_40);
    if (0.3 < fVar9) {
LAB_0078555c:
      dVar3 = deRandom_getUint32(&local_40);
      uVar6 = dVar3 & (0x3fffffU >> (0x17U - cVar1 & 0x1f)) << (0x17U - cVar1 & 0x1f) | 0x400000;
      uVar7 = 0x7f800000;
      if (fVar9 <= 0.3) {
        dVar3 = deRandom_getUint32(&local_40);
        uVar7 = (dVar3 & 0x7f) << 0x17;
      }
    }
    else {
      fVar10 = deRandom_getFloat(&local_40);
      if (fVar10 <= 0.4) goto LAB_0078555c;
      uVar7 = 0x7f800000;
      uVar6 = 0;
    }
    dVar3 = deRandom_getUint32(&local_40);
    *(deUint32 *)((long)*values + uVar5 * 4) = dVar3 << 0x1f | uVar7 | uVar6;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd				(deStringHash(m_name) ^ 0xc2a39fu);
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				mantissaBits	= getMinMantissaBits(precision);
		const deUint32			mantissaMask	= ~getMaxUlpDiffFromBits(mantissaBits) & ((1u<<23)-1u);

		for (int valNdx = 0; valNdx < numValues*scalarSize; valNdx++)
		{
			const bool		isNan		= rnd.getFloat() > 0.3f;
			const bool		isInf		= !isNan && rnd.getFloat() > 0.4f;
			const deUint32	mantissa	= !isInf ? ((1u<<22) | (rnd.getUint32() & mantissaMask)) : 0;
			const deUint32	exp			= !isNan && !isInf ? (rnd.getUint32() & 0x7fu) : 0xffu;
			const deUint32	sign		= rnd.getUint32() & 0x1u;
			const deUint32	value		= (sign << 31) | (exp << 23) | mantissa;

			DE_ASSERT(tcu::Float32(value).isInf() == isInf && tcu::Float32(value).isNaN() == isNan);

			((deUint32*)values[0])[valNdx] = value;
		}
	}